

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O1

Vec_Wrd_t * Abc_SuppReadMin(char *pFileName,int *pnVars)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Vec_Wrd_t *p;
  word *pwVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  ulong Entry;
  uint local_44;
  
  pcVar4 = Extra_FileReadContents(pFileName);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "Cannot open input file (%s).\n";
  }
  else {
    pcVar5 = strstr(pcVar4,"INPUT F-COVER");
    if (pcVar5 != (char *)0x0) {
      pcVar5 = strtok(pcVar5 + 0xd," \t\r\n,");
      uVar2 = atoi(pcVar5);
      uVar9 = (ulong)uVar2;
      if (uVar2 - 0xf4241 < 0xfff0bdc0) {
        puts("The number of cubes in not in the range [1; 1000000].");
      }
      else {
        p = (Vec_Wrd_t *)malloc(0x10);
        p->nCap = 1000;
        p->nSize = 0;
        pwVar6 = (word *)malloc(8000);
        p->pArray = pwVar6;
        pcVar5 = strtok((char *)0x0," \t\r\n,");
        if (pcVar5 == (char *)0x0) {
          local_44 = 0xffffffff;
        }
        else {
          local_44 = 0xffffffff;
          do {
            uVar8 = 0;
            Entry = 0;
            while (sVar7 = strlen(pcVar5), sVar7 < 3) {
              if (pcVar5[1] == '1') {
                if (*pcVar5 != '0') {
LAB_0041d3ab:
                  printf("Strange literal representation (%s) of cube %d.\n",pcVar5,uVar9);
                  goto LAB_0041d409;
                }
              }
              else {
                if ((pcVar5[1] != '0') || (*pcVar5 != '1')) goto LAB_0041d3ab;
                Entry = Entry | 1L << (uVar8 & 0x3f);
              }
              uVar8 = uVar8 + 1;
              pcVar5 = strtok((char *)0x0," \t\r\n,");
              if (pcVar5 == (char *)0x0) goto LAB_0041d3c8;
            }
            iVar3 = strncmp(pcVar5,"INPUT",5);
            if (iVar3 == 0) break;
            if (0x40 < uVar8) {
              printf("The number of inputs (%d) is too high.\n",uVar8 & 0xffffffff);
              goto LAB_0041d409;
            }
            uVar1 = (uint)uVar8;
            if ((local_44 != 0xffffffff) && (uVar1 = local_44, local_44 != (uint)uVar8)) {
              printf("The number of inputs (%d) does not match declaration (%d).\n",(ulong)local_44,
                     uVar8 & 0xffffffff);
              Vec_WrdFree(p);
              return (Vec_Wrd_t *)0x0;
            }
            local_44 = uVar1;
            Vec_WrdPush(p,Entry);
            pcVar5 = strtok((char *)0x0," \t\r\n,");
          } while (pcVar5 != (char *)0x0);
        }
LAB_0041d3c8:
        free(pcVar4);
        if (p->nSize == uVar2) {
          printf("Successfully parsed function with %d inputs and %d cubes.\n",(ulong)local_44,uVar9
                );
          *pnVars = local_44;
          return p;
        }
        printf("The number of cubes (%d) does not match declaration (%d).\n",(ulong)(uint)p->nSize,
               uVar9);
LAB_0041d409:
        if (p->pArray != (word *)0x0) {
          free(p->pArray);
          p->pArray = (word *)0x0;
        }
        free(p);
      }
      return (Vec_Wrd_t *)0x0;
    }
    pcVar4 = "Cannot find beginning of cube cover (%s).\n";
    pFileName = "INPUT F-COVER";
  }
  printf(pcVar4,pFileName);
  return (Vec_Wrd_t *)0x0;
}

Assistant:

Vec_Wrd_t * Abc_SuppReadMin( char * pFileName, int * pnVars )
{
    Vec_Wrd_t * vRes; word uCube;
    int nCubes = 0, nVars = -1, iVar;
    char * pCur, * pToken, * pStart = "INPUT F-COVER";
    char * pStr = Extra_FileReadContents( pFileName );
    if ( pStr == NULL )
        { printf( "Cannot open input file (%s).\n", pFileName ); return NULL; }
    pCur = strstr( pStr, pStart );
    if ( pCur == NULL )
        { printf( "Cannot find beginning of cube cover (%s).\n", pStart ); return NULL; }
    pToken = strtok( pCur + strlen(pStart), " \t\r\n," );
    nCubes = atoi( pToken );
    if ( nCubes < 1 || nCubes > 1000000 )
        { printf( "The number of cubes in not in the range [1; 1000000].\n" ); return NULL; }
    vRes = Vec_WrdAlloc( 1000 );
    uCube = 0; iVar = 0;
    while ( (pToken = strtok(NULL, " \t\r\n,")) != NULL )
    {
        if ( strlen(pToken) > 2 )
        {
            if ( !strncmp(pToken, "INPUT", strlen("INPUT")) )
                break;
            if ( iVar > 64 )
                { printf( "The number of inputs (%d) is too high.\n", iVar ); Vec_WrdFree(vRes); return NULL; }
            if ( nVars == -1 )
                nVars = iVar;
            else if ( nVars != iVar )
                { printf( "The number of inputs (%d) does not match declaration (%d).\n", nVars, iVar ); Vec_WrdFree(vRes); return NULL; }
            Vec_WrdPush( vRes, uCube );
            uCube = 0; iVar = 0;
            continue;
        }
        if ( pToken[1] == '0' && pToken[0] == '1' ) // value 1
            uCube |= (((word)1) << iVar);
        else if ( pToken[1] != '1' || pToken[0] != '0' ) // value 0
            { printf( "Strange literal representation (%s) of cube %d.\n", pToken, nCubes ); Vec_WrdFree(vRes); return NULL; }
        iVar++;
    }
    ABC_FREE( pStr );
    if ( Vec_WrdSize(vRes) != nCubes )
        { printf( "The number of cubes (%d) does not match declaration (%d).\n", Vec_WrdSize(vRes), nCubes ); Vec_WrdFree(vRes); return NULL; }
    else
        printf( "Successfully parsed function with %d inputs and %d cubes.\n", nVars, nCubes );
    *pnVars = nVars;
    return vRes;
}